

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::swap(XmlWriter *this,XmlWriter *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  std::swap<bool>((bool *)in_RDI,(bool *)in_RSI);
  std::swap<bool>((bool *)(in_RDI + 1),(bool *)(in_RSI + 1));
  std::swap<std::__cxx11::string,std::allocator<std::__cxx11::string>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RSI,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RDI);
  std::swap<char,std::char_traits<char>,std::allocator<char>>(in_RSI,in_RDI);
  std::swap<std::ostream*>
            ((basic_ostream<char,_std::char_traits<char>_> **)(in_RDI + 0x40),
             (basic_ostream<char,_std::char_traits<char>_> **)(in_RSI + 0x40));
  return;
}

Assistant:

void swap( XmlWriter& other ) {
            std::swap( m_tagIsOpen, other.m_tagIsOpen );
            std::swap( m_needsNewline, other.m_needsNewline );
            std::swap( m_tags, other.m_tags );
            std::swap( m_indent, other.m_indent );
            std::swap( m_os, other.m_os );
        }